

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptint.c
# Opt level: O3

char * POPT_next_char(char *str)

{
  char *p;
  
  if (*str != '\0') {
    str = str + 1;
  }
  return str;
}

Assistant:

const char *
POPT_next_char (const char *str)
{
    const char *p = str;

    while (*p != '\0') {
	p++;
	if (((unsigned)*p & 0xc0) != (unsigned)0x80)
	    break;
    }
    return p;
}